

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog_util.c
# Opt level: O2

ssize_t xread(file_stream *strm,void *buf,size_t count)

{
  ssize_t sVar1;
  int *piVar2;
  size_t __nbytes;
  size_t sVar3;
  
  sVar3 = count;
  do {
    __nbytes = 0x7fffffff;
    if (sVar3 < 0x7fffffff) {
      __nbytes = sVar3;
    }
LAB_0010258c:
    if (sVar3 == 0) {
LAB_001025c1:
      return count - sVar3;
    }
    sVar1 = read(strm->fd,buf,__nbytes);
    if (sVar1 == 0) goto LAB_001025c1;
    if (sVar1 < 0) {
      piVar2 = __errno_location();
      if ((*piVar2 != 4) && (*piVar2 != 0xb)) {
        msg_errno("Error reading from %s",strm->name);
        return -1;
      }
      goto LAB_0010258c;
    }
    buf = (void *)((long)buf + sVar1);
    sVar3 = sVar3 - sVar1;
  } while( true );
}

Assistant:

ssize_t
xread(struct file_stream *strm, void *buf, size_t count)
{
	char *p = buf;
	size_t orig_count = count;

	while (count != 0) {
		ssize_t res = read(strm->fd, p, MIN(count, INT_MAX));
		if (res == 0)
			break;
		if (res < 0) {
			if (errno == EAGAIN || errno == EINTR)
				continue;
			msg_errno("Error reading from %"TS, strm->name);
			return -1;
		}
		p += res;
		count -= res;
	}
	return orig_count - count;
}